

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::StepDMA(GB *this)

{
  u8 uVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  u16 offset;
  Tick delta;
  GB *this_local;
  
  if ((this->s).dma_start_tick <= (this->s).tick) {
    (this->s).dma_active = true;
    lVar3 = (this->s).tick - (this->s).dma_start_tick;
    if (lVar3 < 0x500) {
      if (((this->s).tick & 7U) == 6) {
        uVar4 = lVar3 >> 3;
        uVar2 = (ushort)uVar4;
        if (uVar2 < 0xa0) {
          uVar1 = Read(this,(this->s).dma_addr + uVar2);
          (this->s).oam[uVar4 & 0xffff] = uVar1;
        }
      }
    }
    else {
      (this->s).dma_start_tick = 0x7fffffffffffffff;
      (this->s).dma_active = false;
    }
  }
  return;
}

Assistant:

void GB::StepDMA() {
  if (s.tick >= s.dma_start_tick) {
    s.dma_active = true;
    Tick delta = s.tick - s.dma_start_tick;
    if (delta >= DMA_TIME) {
      DPRINT(DMA, "dma finished\n");
      s.dma_start_tick = MaxTick;
      s.dma_active = false;
      return;
    }

    if ((s.tick & 7) == 6) {
      u16 offset = delta >> 3;
      if (offset < 160) {
        s.oam[offset] = Read(s.dma_addr + offset);
      }
    }
  }
}